

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodeSetPtr xmlXPathGetElementsByIds(xmlDocPtr doc,xmlChar *ids)

{
  byte *pbVar1;
  xmlNodeSetPtr cur;
  ulong uVar2;
  xmlChar *ID;
  _xmlNode *val;
  int len;
  byte *pbVar3;
  
  if (ids == (xmlChar *)0x0) {
    cur = (xmlNodeSetPtr)0x0;
  }
  else {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating nodeset\n");
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
      pbVar3 = ids;
      while( true ) {
        uVar2 = (ulong)*pbVar3;
        if (0x20 < uVar2) goto LAB_001e1841;
        if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) break;
        pbVar3 = pbVar3 + 1;
      }
joined_r0x001e1821:
      if (uVar2 != 0) {
LAB_001e1841:
        do {
          len = (int)pbVar3 - (int)ids;
          while ((0x20 < (byte)uVar2 || ((0x100002601U >> (uVar2 & 0x3f) & 1) == 0))) {
            pbVar1 = pbVar3 + 1;
            pbVar3 = pbVar3 + 1;
            len = len + 1;
            uVar2 = (ulong)*pbVar1;
          }
          ID = xmlStrndup(ids,len);
          if (ID != (xmlChar *)0x0) {
            val = (_xmlNode *)xmlGetID(doc,ID);
            if ((val != (xmlNodePtr)0x0) &&
               ((val->type == XML_ELEMENT_NODE ||
                ((val->type == XML_ATTRIBUTE_NODE && (val = val->parent, val != (_xmlNode *)0x0)))))
               ) {
              xmlXPathNodeSetAdd(cur,val);
            }
            (*xmlFree)(ID);
          }
          for (; uVar2 = (ulong)*pbVar3, ids = pbVar3, uVar2 < 0x21; pbVar3 = pbVar3 + 1) {
            if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) goto joined_r0x001e1821;
          }
        } while( true );
      }
    }
  }
  return cur;
}

Assistant:

static xmlNodeSetPtr
xmlXPathGetElementsByIds (xmlDocPtr doc, const xmlChar *ids) {
    xmlNodeSetPtr ret;
    const xmlChar *cur = ids;
    xmlChar *ID;
    xmlAttrPtr attr;
    xmlNodePtr elem = NULL;

    if (ids == NULL) return(NULL);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);

    while (IS_BLANK_CH(*cur)) cur++;
    while (*cur != 0) {
	while ((!IS_BLANK_CH(*cur)) && (*cur != 0))
	    cur++;

        ID = xmlStrndup(ids, cur - ids);
	if (ID != NULL) {
	    /*
	     * We used to check the fact that the value passed
	     * was an NCName, but this generated much troubles for
	     * me and Aleksey Sanin, people blatantly violated that
	     * constraint, like Visa3D spec.
	     * if (xmlValidateNCName(ID, 1) == 0)
	     */
	    attr = xmlGetID(doc, ID);
	    if (attr != NULL) {
		if (attr->type == XML_ATTRIBUTE_NODE)
		    elem = attr->parent;
		else if (attr->type == XML_ELEMENT_NODE)
		    elem = (xmlNodePtr) attr;
		else
		    elem = NULL;
                /* TODO: Check memory error. */
		if (elem != NULL)
		    xmlXPathNodeSetAdd(ret, elem);
	    }
	    xmlFree(ID);
	}

	while (IS_BLANK_CH(*cur)) cur++;
	ids = cur;
    }
    return(ret);
}